

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O1

float * floatCalloc(size_t n)

{
  float *__s;
  char msg [256];
  char acStack_128 [264];
  
  __s = (float *)superlu_malloc(n * 4);
  if (__s == (float *)0x0) {
    sprintf(acStack_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in floatCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/smemory.c");
    superlu_abort_and_exit(acStack_128);
  }
  if (n != 0) {
    memset(__s,0,n * 4);
  }
  return __s;
}

Assistant:

float *floatCalloc(size_t n)
{
    float *buf;
    register size_t i;
    float zero = 0.0;
    buf = (float *) SUPERLU_MALLOC(n * (size_t) sizeof(float));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in floatCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}